

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateMakeRule
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Base_ptr p_Var3;
  long *plVar4;
  string filebase;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  CppGenerator geneartor;
  string local_a48;
  long *local_a28;
  long local_a20;
  long local_a18;
  long lStack_a10;
  string *local_a08;
  string local_a00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e0;
  undefined1 local_9b0 [1640];
  IDLOptionsCpp local_348;
  
  StripExtension((string *)local_9b0,filename);
  StripPath(&local_a00,(string *)local_9b0);
  if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) {
    operator_delete((void *)local_9b0._0_8_,local_9b0._16_8_ + 1);
  }
  IDLOptions::IDLOptions(&local_348.super_IDLOptions,&parser->opts);
  local_348.super_IDLOptions._780_4_ = 1;
  local_348.g_only_fixed_enums = true;
  cpp::CppGenerator::CppGenerator((CppGenerator *)local_9b0,parser,path,filename,&local_348);
  IDLOptions::~IDLOptions(&local_348.super_IDLOptions);
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_9e0,parser,filename);
  BaseGenerator::GeneratedFileName
            (&local_a48,(BaseGenerator *)local_9b0,path,&local_a00,&parser->opts);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a48);
  local_a28 = &local_a18;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a18 = *plVar4;
    lStack_a10 = plVar2[3];
  }
  else {
    local_a18 = *plVar4;
    local_a28 = (long *)*plVar2;
  }
  local_a20 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_a08 = output;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &local_9e0._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_9e0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var3 = local_9e0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::operator+(&local_a48," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
      std::__cxx11::string::_M_append((char *)&local_a28,(ulong)local_a48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
        operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_9e0);
  cpp::CppGenerator::~CppGenerator((CppGenerator *)local_9b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::operator=((string *)local_a08,(string *)&local_a28);
  if (local_a28 != &local_a18) {
    operator_delete(local_a28,local_a18 + 1);
  }
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = CPPMakeRule(parser, path, filename);
    return Status::OK;
  }